

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager_test.cpp
# Opt level: O3

void __thiscall
JobManagerTestSuite_StartStopSuccess_Test::~JobManagerTestSuite_StartStopSuccess_Test
          (JobManagerTestSuite_StartStopSuccess_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(JobManagerTestSuite, StartStopSuccess)
// Stop jobs fail
{
    TestContext ctx;
    SetInitialExpectations(ctx);

    // Formally set default PSKc
    ctx.mConf.mPSKc = {'1', '0'};

    using namespace ot::commissioner::persistent_storage;
    // Prepare test data
    NetworkId      nid;
    BorderRouterId rid;

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan1", 1, 1, 0x1, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan2", 2, 2, 0x2, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20002, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan3", 3, 3, 0x3, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 2);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20003, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 2);

    Init(ctx, ".");

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[3] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};

    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(3)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));

    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"start"}, {0x1, 0x2, 0x3}, false).mCode, ErrorCode::kNone);
    EXPECT_EQ(camIdx, 3);

    std::thread::id current = std::this_thread::get_id();
    std::thread::id ids[3];
    for (camIdx = 0; camIdx < 3; ++camIdx)
    {
        EXPECT_CALL(*commissionerAppMocks[camIdx], Start(_, _, _))
            .Times(1)
            .WillOnce(DoAll(Invoke([camIdx, &ids]() { ids[camIdx] = std::this_thread::get_id(); }), Return(Error{})));
    }

    ctx.mJobManager.RunJobs();
    for (camIdx = 0; camIdx < 3; ++camIdx)
    {
        // Expected function did't run in the current thread
        EXPECT_NE(current, ids[camIdx]);
        // Expected function did actually run (thread identifier was set to the value other than default)
        EXPECT_NE(ids[camIdx], std::thread::id());
    }

    for (camIdx = 0; camIdx < 3; ++camIdx)
    {
        ids[camIdx] = current;
        EXPECT_CALL(*commissionerAppMocks[camIdx], Stop()).WillOnce(Invoke([camIdx, &ids]() {
            ids[camIdx] = std::this_thread::get_id();
        }));
        EXPECT_CALL(*commissionerAppMocks[camIdx], IsActive()).WillOnce(Return(true));
    }
    ctx.mJobManager.CleanupJobs();

    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"stop"}, {0x1, 0x2, 0x3}, false).mCode, ErrorCode::kNone);
    ctx.mJobManager.RunJobs();
    for (camIdx = 0; camIdx < 3; ++camIdx)
    {
        // Expected function didn't run in the current thread
        EXPECT_NE(current, ids[camIdx]);
        // Expected function did actually run (thread identifier was set to the value other than default)
        EXPECT_NE(ids[camIdx], std::thread::id());
    }
}